

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple-test.c++
# Opt level: O2

void __thiscall kj::TestCase93::run(TestCase93 *this)

{
  TupleElement<2U,_unsigned_int> *params_2;
  TupleElement<3U,_kj::StringPtr> *params_2_00;
  StringPtr *params_2_01;
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  char (*in_R9) [4];
  undefined1 local_a0 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  uint i;
  Tuple<uint_&,_StringPtr_&,_uint,_StringPtr> t;
  char *local_40;
  undefined8 local_38;
  
  uVar4 = 0x7b;
  local_40 = "foo";
  local_38 = 4;
  local_a0._0_4_ = 0x141;
  i = uVar4;
  refTuple<unsigned_int&,kj::StringPtr&,int,char_const(&)[4]>
            ((ExpandAndApplyResult<kj::_::MakeRefTupleFunc,_unsigned_int_&,_kj::StringPtr_&,_int,_const_char_(&)[4]>
              *)&_kjCondition,(kj *)&i,(uint *)&local_40,(StringPtr *)local_a0,(int *)0x401abd,in_R9
            );
  uVar1 = (uint)_kjCondition.op.content.ptr;
  params_2_01 = (StringPtr *)CONCAT44(_kjCondition._12_4_,_kjCondition.right);
  t.impl.super_TupleElement<0U,_unsigned_int_&>.value = _kjCondition.left;
  t.impl.super_TupleElement<2U,_unsigned_int>.value = (uint)_kjCondition.op.content.ptr;
  t.impl.super_TupleElement<1U,_kj::StringPtr_&>.value = params_2_01;
  sVar3 = strlen((char *)_kjCondition.op.content.size_);
  t.impl.super_TupleElement<3U,_kj::StringPtr>.value.content.size_ = sVar3 + 1;
  t.impl.super_TupleElement<3U,_kj::StringPtr>.value.content.ptr =
       (char *)_kjCondition.op.content.size_;
  _kjCondition.result = *_kjCondition.left == 0x7b;
  _kjCondition.right = 0x7b;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  uVar2 = uVar4;
  if ((!_kjCondition.result) && (uVar2 = _kjCondition.right, kj::_::Debug::minSeverity < 3)) {
    local_a0._0_4_ = 0x7b;
    _kjCondition.right = uVar4;
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x62,ERROR,
               "\"failed: expected \" \"(get<0>(t)) == (123)\", _kjCondition, get<0>(t), 123",
               (char (*) [38])"failed: expected (get<0>(t)) == (123)",&_kjCondition,
               _kjCondition.left,(int *)local_a0);
    uVar2 = _kjCondition.right;
  }
  _kjCondition.right = uVar2;
  params_2 = &t.impl.super_TupleElement<2U,_unsigned_int>;
  local_a0 = (undefined1  [8])params_2_01;
  kj::_::DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)local_a0,(char (*) [4])0x423c58);
  if (kj::_::Debug::minSeverity < 3 && _kjCondition.result == false) {
    kj::_::Debug::
    log<char_const(&)[40],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&,kj::StringPtr&,char_const(&)[4]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,99,ERROR,
               "\"failed: expected \" \"(get<1>(t)) == (\\\"foo\\\")\", _kjCondition, get<1>(t), \"foo\""
               ,(char (*) [40])"failed: expected (get<1>(t)) == (\"foo\")",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,params_2_01,
               (char (*) [4])0x423c58);
  }
  _kjCondition.right = 0x141;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = uVar1 == 0x141;
  _kjCondition.left = &params_2->value;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_a0._0_4_ = 0x141;
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,100,ERROR,
               "\"failed: expected \" \"(get<2>(t)) == (321)\", _kjCondition, get<2>(t), 321",
               (char (*) [38])"failed: expected (get<2>(t)) == (321)",&_kjCondition,&params_2->value
               ,(int *)local_a0);
  }
  local_a0 = (undefined1  [8])&t.impl.super_TupleElement<3U,_kj::StringPtr>;
  kj::_::DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)local_a0,(char (*) [4])0x401abd);
  if (kj::_::Debug::minSeverity < 3 && _kjCondition.result == false) {
    kj::_::Debug::
    log<char_const(&)[40],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&,kj::StringPtr&,char_const(&)[4]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x65,ERROR,
               "\"failed: expected \" \"(get<3>(t)) == (\\\"bar\\\")\", _kjCondition, get<3>(t), \"bar\""
               ,(char (*) [40])"failed: expected (get<3>(t)) == (\"bar\")",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
               &t.impl.super_TupleElement<3U,_kj::StringPtr>.value,(char (*) [4])0x401abd);
  }
  i = 0x1c8;
  local_40 = "baz";
  local_38 = 4;
  _kjCondition.result = *t.impl.super_TupleElement<0U,_unsigned_int_&>.value == 0x1c8;
  _kjCondition.left = t.impl.super_TupleElement<0U,_unsigned_int_&>.value;
  _kjCondition.right = 0x1c8;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_a0._0_4_ = 0x1c8;
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x6a,ERROR,
               "\"failed: expected \" \"(get<0>(t)) == (456)\", _kjCondition, get<0>(t), 456",
               (char (*) [38])"failed: expected (get<0>(t)) == (456)",&_kjCondition,
               t.impl.super_TupleElement<0U,_unsigned_int_&>.value,(int *)local_a0);
  }
  local_a0 = (undefined1  [8])t.impl.super_TupleElement<1U,_kj::StringPtr_&>.value;
  kj::_::DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)local_a0,(char (*) [4])0x3f3548);
  if (kj::_::Debug::minSeverity < 3 && _kjCondition.result == false) {
    kj::_::Debug::
    log<char_const(&)[40],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&,kj::StringPtr&,char_const(&)[4]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x6b,ERROR,
               "\"failed: expected \" \"(get<1>(t)) == (\\\"baz\\\")\", _kjCondition, get<1>(t), \"baz\""
               ,(char (*) [40])"failed: expected (get<1>(t)) == (\"baz\")",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
               t.impl.super_TupleElement<1U,_kj::StringPtr_&>.value,(char (*) [4])0x3f3548);
  }
  _kjCondition.right = 0x141;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = t.impl.super_TupleElement<2U,_unsigned_int>.value == 0x141;
  _kjCondition.op.content.size_ = 5;
  params_2_00 = &t.impl.super_TupleElement<3U,_kj::StringPtr>;
  _kjCondition.left = &params_2->value;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_a0._0_4_ = 0x141;
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x6c,ERROR,
               "\"failed: expected \" \"(get<2>(t)) == (321)\", _kjCondition, get<2>(t), 321",
               (char (*) [38])"failed: expected (get<2>(t)) == (321)",&_kjCondition,&params_2->value
               ,(int *)local_a0);
  }
  local_a0 = (undefined1  [8])params_2_00;
  kj::_::DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)local_a0,(char (*) [4])0x401abd);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[40],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&,kj::StringPtr&,char_const(&)[4]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x6d,ERROR,
               "\"failed: expected \" \"(get<3>(t)) == (\\\"bar\\\")\", _kjCondition, get<3>(t), \"bar\""
               ,(char (*) [40])"failed: expected (get<3>(t)) == (\"bar\")",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
               &params_2_00->value,(char (*) [4])0x401abd);
  }
  return;
}

Assistant:

TEST(Tuple, RefTuple) {
  uint i = 123;
  StringPtr s = "foo";

  Tuple<uint&, StringPtr&, uint, StringPtr> t = refTuple(i, s, 321, "bar");
  EXPECT_EQ(get<0>(t), 123);
  EXPECT_EQ(get<1>(t), "foo");
  EXPECT_EQ(get<2>(t), 321);
  EXPECT_EQ(get<3>(t), "bar");

  i = 456;
  s = "baz";

  EXPECT_EQ(get<0>(t), 456);
  EXPECT_EQ(get<1>(t), "baz");
  EXPECT_EQ(get<2>(t), 321);
  EXPECT_EQ(get<3>(t), "bar");
}